

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern_tests.cc
# Opt level: O0

void __thiscall
lf::refinement::test::TopRefTest_TopQuadRef_Test::TestBody(TopRefTest_TopQuadRef_Test *this)

{
  bool bVar1;
  RefEl RVar2;
  uint uVar3;
  size_type sVar4;
  ostream *poVar5;
  void *pvVar6;
  char *pcVar7;
  __type _Var8;
  AssertHelper local_2e0;
  Message local_2d8;
  double local_2d0;
  uint local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  lt_polys_t child_polygons_5;
  undefined1 local_290 [8];
  Hybrid2DRefinementPattern rp_5;
  Message local_268;
  double local_260;
  uint local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_4;
  lt_polys_t child_polygons_4;
  undefined1 local_220 [8];
  Hybrid2DRefinementPattern rp_4;
  int anchor_3;
  Message local_1f0;
  double local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_3;
  lt_polys_t child_polygons_3;
  undefined1 local_1a8 [8];
  Hybrid2DRefinementPattern rp_3;
  int anchor_2;
  Message local_178;
  double local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  lt_polys_t child_polygons_2;
  undefined1 local_130 [8];
  Hybrid2DRefinementPattern rp_2;
  int anchor_1;
  Message local_100;
  double local_f8;
  uint local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  lt_polys_t child_polygons_1;
  undefined1 local_b8 [8];
  Hybrid2DRefinementPattern rp_1;
  int anchor;
  Message local_88;
  double local_80;
  uint local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  lt_polys_t child_polygons;
  undefined1 local_30 [8];
  Hybrid2DRefinementPattern rp;
  TopRefTest_TopQuadRef_Test *this_local;
  
  rp._24_8_ = this;
  child_polygons.
  super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = lf::base::RefEl::kQuad();
  Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
            ((Hybrid2DRefinementPattern *)local_30,
             child_polygons.
             super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,rp_copy);
  Hybrid2DRefinementPattern::ChildPolygons
            ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
              *)local_50,(Hybrid2DRefinementPattern *)local_30,0);
  poVar5 = std::operator<<((ostream *)&std::cout,"COPY: ");
  poVar5 = test::operator<<(poVar5,(lt_polys_t *)local_50);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
  uVar3 = SumTwiceAreaPolygons((lt_polys_t *)local_50);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  local_74 = SumTwiceAreaPolygons((lt_polys_t *)local_50);
  sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_30);
  _Var8 = std::pow<unsigned_int,int>(sVar4,2);
  local_80 = _Var8 + _Var8;
  testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
            ((EqHelper *)local_70,"SumTwiceAreaPolygons(child_polygons)",
             "2 * std::pow(rp.LatticeConst(), 2)",&local_74,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
               ,0xb4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff70,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             *)local_50);
  for (rp_1._28_4_ = 0; (int)rp_1._28_4_ < 4; rp_1._28_4_ = rp_1._28_4_ + 1) {
    RVar2 = lf::base::RefEl::kQuad();
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
              ((Hybrid2DRefinementPattern *)local_b8,RVar2,rp_trisect,rp_1._28_4_);
    Hybrid2DRefinementPattern::ChildPolygons
              ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                *)&gtest_ar_1.message_,(Hybrid2DRefinementPattern *)local_b8,0);
    poVar5 = std::operator<<((ostream *)&std::cout,"TRISECT(anchor=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rp_1._28_4_);
    poVar5 = std::operator<<(poVar5,") : ");
    poVar5 = test::operator<<(poVar5,(lt_polys_t *)&gtest_ar_1.message_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
    uVar3 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_1.message_);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_ec = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_1.message_);
    sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_b8);
    _Var8 = std::pow<unsigned_int,int>(sVar4,2);
    local_f8 = _Var8 + _Var8;
    testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
              ((EqHelper *)local_e8,"SumTwiceAreaPolygons(child_polygons)",
               "2 * std::pow(rp.LatticeConst(), 2)",&local_ec,&local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffef8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xbf,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
               *)&gtest_ar_1.message_);
  }
  for (rp_2._28_4_ = 0; (int)rp_2._28_4_ < 4; rp_2._28_4_ = rp_2._28_4_ + 1) {
    RVar2 = lf::base::RefEl::kQuad();
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
              ((Hybrid2DRefinementPattern *)local_130,RVar2,rp_quadsect,rp_2._28_4_);
    Hybrid2DRefinementPattern::ChildPolygons
              ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                *)&gtest_ar_2.message_,(Hybrid2DRefinementPattern *)local_130,0);
    poVar5 = std::operator<<((ostream *)&std::cout,"QUADSECT(anchor=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rp_2._28_4_);
    poVar5 = std::operator<<(poVar5,") : ");
    poVar5 = test::operator<<(poVar5,(lt_polys_t *)&gtest_ar_2.message_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
    uVar3 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_2.message_);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_164 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_2.message_);
    sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_130);
    _Var8 = std::pow<unsigned_int,int>(sVar4,2);
    local_170 = _Var8 + _Var8;
    testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
              ((EqHelper *)local_160,"SumTwiceAreaPolygons(child_polygons)",
               "2 * std::pow(rp.LatticeConst(), 2)",&local_164,&local_170);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xca,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe80,&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe80);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
               *)&gtest_ar_2.message_);
  }
  for (rp_3._28_4_ = 0; (int)rp_3._28_4_ < 4; rp_3._28_4_ = rp_3._28_4_ + 1) {
    RVar2 = lf::base::RefEl::kQuad();
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
              ((Hybrid2DRefinementPattern *)local_1a8,RVar2,rp_split,rp_3._28_4_);
    Hybrid2DRefinementPattern::ChildPolygons
              ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                *)&gtest_ar_3.message_,(Hybrid2DRefinementPattern *)local_1a8,0);
    poVar5 = std::operator<<((ostream *)&std::cout,"Split(anchor=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rp_3._28_4_);
    poVar5 = std::operator<<(poVar5,") : ");
    poVar5 = test::operator<<(poVar5,(lt_polys_t *)&gtest_ar_3.message_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
    uVar3 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_3.message_);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_1dc = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_3.message_);
    sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_1a8);
    _Var8 = std::pow<unsigned_int,int>(sVar4,2);
    local_1e8 = _Var8 + _Var8;
    testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
              ((EqHelper *)local_1d8,"SumTwiceAreaPolygons(child_polygons)",
               "2 * std::pow(rp.LatticeConst(), 2)",&local_1dc,&local_1e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xd5,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe08,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe08);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
               *)&gtest_ar_3.message_);
  }
  for (rp_4._28_4_ = 0; (int)rp_4._28_4_ < 4; rp_4._28_4_ = rp_4._28_4_ + 1) {
    RVar2 = lf::base::RefEl::kQuad();
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
              ((Hybrid2DRefinementPattern *)local_220,RVar2,rp_threeedge,rp_4._28_4_);
    Hybrid2DRefinementPattern::ChildPolygons
              ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                *)&gtest_ar_4.message_,(Hybrid2DRefinementPattern *)local_220,0);
    poVar5 = std::operator<<((ostream *)&std::cout,"THREEEDGE(anchor=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rp_4._28_4_);
    poVar5 = std::operator<<(poVar5,") : ");
    poVar5 = test::operator<<(poVar5,(lt_polys_t *)&gtest_ar_4.message_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
    uVar3 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_4.message_);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_254 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_4.message_);
    sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_220);
    _Var8 = std::pow<unsigned_int,int>(sVar4,2);
    local_260 = _Var8 + _Var8;
    testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
              ((EqHelper *)local_250,"SumTwiceAreaPolygons(child_polygons)",
               "2 * std::pow(rp.LatticeConst(), 2)",&local_254,&local_260);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&rp_5.anchor_set_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xe0,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&rp_5.anchor_set_,&local_268);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rp_5.anchor_set_);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
               *)&gtest_ar_4.message_);
  }
  RVar2 = lf::base::RefEl::kQuad();
  Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
            ((Hybrid2DRefinementPattern *)local_290,RVar2,rp_regular);
  Hybrid2DRefinementPattern::ChildPolygons
            ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
              *)&gtest_ar_5.message_,(Hybrid2DRefinementPattern *)local_290,0);
  poVar5 = std::operator<<((ostream *)&std::cout,"BARYCENTRIC: ");
  poVar5 = test::operator<<(poVar5,(lt_polys_t *)&gtest_ar_5.message_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Area = ");
  uVar3 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_5.message_);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  local_2c4 = SumTwiceAreaPolygons((lt_polys_t *)&gtest_ar_5.message_);
  sVar4 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_290);
  _Var8 = std::pow<unsigned_int,int>(sVar4,2);
  local_2d0 = _Var8 + _Var8;
  testing::internal::EqHelper::Compare<unsigned_int,_double,_nullptr>
            ((EqHelper *)local_2c0,"SumTwiceAreaPolygons(child_polygons)",
             "2 * std::pow(rp.LatticeConst(), 2)",&local_2c4,&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
               ,0xe9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             *)&gtest_ar_5.message_);
  return;
}

Assistant:

TEST(TopRefTest, TopQuadRef) {
  // Check the various refinements
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_copy);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "COPY: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_trisect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "TRISECT(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_quadsect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "QUADSECT(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_split,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "Split(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_threeedge,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "THREEEDGE(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_regular);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "BARYCENTRIC: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
}